

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost.c
# Opt level: O2

void VP8EncDspCostInit(void)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&VP8EncDspCostInit::VP8EncDspCostInit_body_lock);
  if (iVar1 != 0) {
    return;
  }
  if (VP8EncDspCostInit::VP8EncDspCostInit_body_last_cpuinfo_used != VP8GetCPUInfo) {
    VP8GetResidualCost = GetResidualCost_C;
    VP8SetResidualCoeffs = SetResidualCoeffs_C;
    if (VP8GetCPUInfo != (VP8CPUInfo)0x0) {
      iVar1 = (*VP8GetCPUInfo)(kSSE2);
      if (iVar1 != 0) {
        VP8EncDspCostInitSSE2();
      }
    }
  }
  VP8EncDspCostInit::VP8EncDspCostInit_body_last_cpuinfo_used = VP8GetCPUInfo;
  pthread_mutex_unlock((pthread_mutex_t *)&VP8EncDspCostInit::VP8EncDspCostInit_body_lock);
  return;
}

Assistant:

WEBP_DSP_INIT_FUNC(VP8EncDspCostInit) {
  VP8GetResidualCost = GetResidualCost_C;
  VP8SetResidualCoeffs = SetResidualCoeffs_C;

  // If defined, use CPUInfo() to overwrite some pointers with faster versions.
  if (VP8GetCPUInfo != NULL) {
#if defined(WEBP_USE_MIPS32)
    if (VP8GetCPUInfo(kMIPS32)) {
      VP8EncDspCostInitMIPS32();
    }
#endif
#if defined(WEBP_USE_MIPS_DSP_R2)
    if (VP8GetCPUInfo(kMIPSdspR2)) {
      VP8EncDspCostInitMIPSdspR2();
    }
#endif
#if defined(WEBP_HAVE_SSE2)
    if (VP8GetCPUInfo(kSSE2)) {
      VP8EncDspCostInitSSE2();
    }
#endif
#if defined(WEBP_HAVE_NEON)
    if (VP8GetCPUInfo(kNEON)) {
      VP8EncDspCostInitNEON();
    }
#endif
  }
}